

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_nop_implied_instructions.cpp
# Opt level: O2

void __thiscall
(anonymous_namespace)::NopImpliedFixture_nop_implied_Test::~NopImpliedFixture_nop_implied_Test
          (NopImpliedFixture_nop_implied_Test *this)

{
  anon_unknown.dwarf_206cbb::NopImpliedFixture_nop_implied_Test::~NopImpliedFixture_nop_implied_Test
            ((NopImpliedFixture_nop_implied_Test *)(this + -0x118));
  return;
}

Assistant:

TEST_P(NopImpliedFixture, nop_implied) {
    stage_instruction(GetParam());

    step_execution(2);
    EXPECT_EQ(expected, registers);
}